

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights8(word *t,int nVars,int *pW)

{
  int Cost;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int i;
  long lVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  
  iVar6 = 1;
  uVar7 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 8) {
    __assert_fail("nVars == 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0x130,"int Extra_ThreshSelectWeights8(word *, int, int *)");
  }
  pW[7] = 1;
  iVar12 = 0;
  do {
    iVar11 = iVar12;
    if (iVar12 < 8) {
      iVar11 = 8;
    }
    pW[6] = iVar6;
    iVar8 = iVar6;
    do {
      pW[5] = iVar8;
      iVar1 = iVar8;
      do {
        pW[4] = iVar1;
        iVar16 = iVar1;
        do {
          pW[3] = iVar16;
          iVar17 = iVar16;
          do {
            pW[2] = iVar17;
            iVar13 = iVar17;
            do {
              pW[1] = iVar13;
              iVar14 = iVar13;
              do {
                *pW = iVar14;
                iVar4 = iVar14;
                do {
                  iVar2 = 10000;
                  uVar10 = 0;
                  bVar18 = true;
                  iVar5 = 0;
                  do {
                    uVar9 = (uint)uVar10;
                    lVar15 = 0;
                    if ((t[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
                      iVar3 = 0;
                      do {
                        if ((uVar9 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                          iVar3 = iVar3 + pW[lVar15];
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 != 8);
                      if (iVar5 <= iVar3) {
                        iVar5 = iVar3;
                      }
                    }
                    else {
                      iVar3 = 0;
                      do {
                        if ((uVar9 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
                          iVar3 = iVar3 + pW[lVar15];
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 != 8);
                      if (iVar3 <= iVar2) {
                        iVar2 = iVar3;
                      }
                    }
                    if (iVar2 <= iVar5) break;
                    uVar9 = uVar9 + 1;
                    uVar10 = (ulong)uVar9;
                    bVar18 = (int)uVar9 < (int)uVar7;
                  } while (uVar9 != uVar7);
                  if (!bVar18) {
                    if (iVar5 < iVar2) {
                      return iVar2;
                    }
                    __assert_fail("Lmax < Lmin",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                                  ,0x149,"int Extra_ThreshSelectWeights8(word *, int, int *)");
                  }
                  *pW = iVar4 + 1;
                  bVar18 = iVar4 < 9;
                  iVar4 = iVar4 + 1;
                } while (bVar18);
                pW[1] = iVar14 + 1;
                bVar18 = iVar14 < 9;
                iVar14 = iVar14 + 1;
              } while (bVar18);
              pW[2] = iVar13 + 1;
              bVar18 = iVar13 < 9;
              iVar13 = iVar13 + 1;
            } while (bVar18);
            pW[3] = iVar17 + 1;
            bVar18 = iVar17 < 9;
            iVar17 = iVar17 + 1;
          } while (bVar18);
          pW[4] = iVar16 + 1;
          bVar18 = iVar16 < 9;
          iVar16 = iVar16 + 1;
        } while (bVar18);
        pW[5] = iVar1 + 1;
        bVar18 = iVar1 < 9;
        iVar1 = iVar1 + 1;
      } while (bVar18);
      pW[6] = iVar8 + 1;
      bVar18 = iVar8 != iVar11 + 1;
      iVar8 = iVar8 + 1;
    } while (bVar18);
    iVar6 = iVar6 + 1;
    pW[7] = iVar6;
    iVar12 = iVar12 + 1;
    if (iVar12 == 9) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights8(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 1; // <<-- incomplete detection to save runtime!
    assert(nVars == 8);
    for (pW[7] = 1; pW[7] <= Limit; pW[7]++)
        for (pW[6] = pW[7]; pW[6] <= Limit; pW[6]++)
            for (pW[5] = pW[6]; pW[5] <= Limit; pW[5]++)
                for (pW[4] = pW[5]; pW[4] <= Limit; pW[4]++)
                    for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
                        for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                            for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                                for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                                    Lmin = 10000;
                                    Lmax = 0;
                                    for (m = 0; m < nMints; m++) {
                                        if (Abc_TtGetBit(t, m))
                                            Lmin = Abc_MinInt(Lmin,
                                                    Extra_ThreshWeightedSum(pW,
                                                            nVars, m));
                                        else
                                            Lmax = Abc_MaxInt(Lmax,
                                                    Extra_ThreshWeightedSum(pW,
                                                            nVars, m));
                                        if (Lmax >= Lmin)
                                            break;
                                    }
                                    if (m < nMints)
                                        continue;
                                    assert(Lmax < Lmin);
                                    return Lmin;
                                }
    return 0;
}